

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font_baker * nk_font_baker(void *memory,int glyph_count,int count,nk_allocator *alloc)

{
  nk_font_baker *baker;
  nk_allocator *alloc_local;
  int count_local;
  int glyph_count_local;
  void *memory_local;
  
  if (memory == (void *)0x0) {
    memory_local = (void *)0x0;
  }
  else {
    memory_local = (void *)((long)memory + 7U & 0xfffffffffffffff8);
    ((nk_handle *)((long)memory_local + 0x48))->ptr = (nk_handle *)((long)memory_local + 0x68);
    ((nk_handle *)((long)memory_local + 0x50))->ptr =
         (void *)((long)((nk_handle *)((long)memory_local + 0x48))->ptr + (long)count * 0x48 + 3 &
                 0xfffffffffffffffc);
    ((nk_handle *)((long)memory_local + 0x58))->ptr =
         (void *)((long)((nk_handle *)((long)memory_local + 0x50))->ptr +
                  (long)glyph_count * 0x1c + 3 & 0xfffffffffffffffc);
    ((nk_handle *)((long)memory_local + 0x60))->ptr =
         (void *)((long)((nk_handle *)((long)memory_local + 0x58))->ptr +
                  (long)glyph_count * 0x10 + 7 & 0xfffffffffffffff8);
    *(nk_handle *)memory_local = alloc->userdata;
    *(nk_plugin_alloc *)((long)memory_local + 8) = alloc->alloc;
    *(nk_plugin_free *)((long)memory_local + 0x10) = alloc->free;
  }
  return (nk_font_baker *)memory_local;
}

Assistant:

NK_INTERN struct nk_font_baker*
nk_font_baker(void *memory, int glyph_count, int count, struct nk_allocator *alloc)
{
    struct nk_font_baker *baker;
    if (!memory) return 0;
    /* setup baker inside a memory block  */
    baker = (struct nk_font_baker*)NK_ALIGN_PTR(memory, nk_baker_align);
    baker->build = (struct nk_font_bake_data*)NK_ALIGN_PTR((baker + 1), nk_build_align);
    baker->packed_chars = (struct nk_tt_packedchar*)NK_ALIGN_PTR((baker->build + count), nk_char_align);
    baker->rects = (struct nk_rp_rect*)NK_ALIGN_PTR((baker->packed_chars + glyph_count), nk_rect_align);
    baker->ranges = (struct nk_tt_pack_range*)NK_ALIGN_PTR((baker->rects + glyph_count), nk_range_align);
    baker->alloc = *alloc;
    return baker;
}